

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_> __thiscall
kj::anon_unknown_9::DiskHandle::tryOpenFile(DiskHandle *this,PathPtr path)

{
  int iVar1;
  int code;
  ReadableFile *extraout_RDX;
  ReadableFile *extraout_RDX_00;
  ReadableFile *extraout_RDX_01;
  ReadableFile *pRVar2;
  char *__file;
  Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_> MVar3;
  Fault f;
  OwnFd local_60;
  OwnFd local_5c;
  Array<char> local_58;
  PathPtr local_40;
  
  local_40.parts.ptr = (String *)path.parts.size_;
  do {
    iVar1 = *(int *)&((path.parts.ptr)->content).ptr;
    PathPtr::toString((String *)&local_58,&local_40,false);
    __file = "";
    if (local_58.size_ != 0) {
      __file = local_58.ptr;
    }
    iVar1 = openat64(iVar1,__file,0x80000);
    Array<char>::~Array(&local_58);
    if (-1 < iVar1) goto LAB_0041c05c;
    code = kj::_::Debug::getOsErrorNumber(false);
  } while (code == -1);
  if (code == 0) {
LAB_0041c05c:
    local_5c.fd = -1;
    local_60.fd = iVar1;
    newDiskReadableFile((kj *)&local_58,&local_60);
    *(char **)this = local_58.ptr;
    *(size_t *)(this + 2) = local_58.size_;
    local_58.size_ = 0;
    Own<kj::ReadableFile,_std::nullptr_t>::dispose
              ((Own<kj::ReadableFile,_std::nullptr_t> *)&local_58);
    OwnFd::~OwnFd(&local_60);
    OwnFd::~OwnFd(&local_5c);
    pRVar2 = extraout_RDX_00;
  }
  else if ((code == 0x14) || (code == 2)) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 2) = 0;
    pRVar2 = extraout_RDX;
  }
  else {
    kj::_::Debug::Fault::Fault<int,kj::PathPtr&>
              ((Fault *)&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x302,code,"openat(fd, path, O_RDONLY)","path",&local_40);
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 2) = 0;
    kj::_::Debug::Fault::~Fault((Fault *)&local_58);
    pRVar2 = extraout_RDX_01;
  }
  MVar3.ptr.ptr = pRVar2;
  MVar3.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_>)MVar3.ptr;
}

Assistant:

Maybe<Own<const ReadableFile>> tryOpenFile(PathPtr path) const {
    int newFd;
    KJ_SYSCALL_HANDLE_ERRORS(newFd = openat(
        fd, path.toString().cStr(), O_RDONLY | MAYBE_O_CLOEXEC)) {
      case ENOENT:
      case ENOTDIR:
        return kj::none;
      default:
        KJ_FAIL_SYSCALL("openat(fd, path, O_RDONLY)", error, path) { return kj::none; }
    }

    kj::OwnFd result(newFd);
#ifndef O_CLOEXEC
    setCloexec(result);
#endif

    return newDiskReadableFile(kj::mv(result));
  }